

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O1

void __thiscall
glcts::anon_unknown_0::SubroutineFunction::SubroutineFunction
          (SubroutineFunction *this,UniformValueGenerator *generator,Index _index)

{
  UniformType local_b0;
  
  (this->index).super_LayoutSpecifierBase.val = (int)_index.super_LayoutSpecifierBase._0_8_;
  (this->index).super_LayoutSpecifierBase.numSys =
       (int)((ulong)_index.super_LayoutSpecifierBase._0_8_ >> 0x20);
  (this->index).super_LayoutSpecifierBase.occurence.occurence =
       _index.super_LayoutSpecifierBase.occurence.occurence.occurence;
  UniformType::UniformType(&local_b0,0x8b52,0);
  UniformValue::UniformValue(&this->embeddedRetVal,&local_b0,generator);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.refStrType._M_dataplus._M_p != &local_b0.refStrType.field_2) {
    operator_delete(local_b0.refStrType._M_dataplus._M_p,
                    local_b0.refStrType.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.strType._M_dataplus._M_p != &local_b0.strType.field_2) {
    operator_delete(local_b0.strType._M_dataplus._M_p,
                    local_b0.strType.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ::~vector(&local_b0.childTypes);
  if (local_b0.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_b0.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

SubroutineFunction(UniformValueGenerator& generator, Index _index = Index::Implicit())
		: index(_index), embeddedRetVal(GL_FLOAT_VEC4, generator)
	{
	}